

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeDualfarkas4Col
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *direction)

{
  uint *puVar1;
  pointer pnVar2;
  int iVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  long lVar5;
  uint uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sign;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  uVar6 = 0x3ff00000;
  if ((direction->m_backend).fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&local_128,0,(type *)0x0);
    iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&direction->m_backend,&local_128);
    uVar6 = 0x3ff00000;
    if (0 < iVar3) {
      uVar6 = 0xbff00000;
    }
  }
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_128,(double)((ulong)uVar6 << 0x20));
  (this->dualFarkas).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(&this->dualFarkas,(this->theCoPvec->thedelta).super_IdxSet.num);
  pUVar4 = this->theCoPvec;
  if (0 < (pUVar4->thedelta).super_IdxSet.num) {
    lVar5 = 0;
    do {
      iVar3 = (pUVar4->thedelta).super_IdxSet.idx[lVar5];
      pnVar2 = (pUVar4->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_d8.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar3].m_backend.data;
      local_d8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar2[iVar3].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar2[iVar3].m_backend.data + 0x10);
      local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar2[iVar3].m_backend.data + 0x20);
      local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar2[iVar3].m_backend.data + 0x30);
      local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_d8.exp = pnVar2[iVar3].m_backend.exp;
      local_d8.neg = pnVar2[iVar3].m_backend.neg;
      local_d8.fpclass = pnVar2[iVar3].m_backend.fpclass;
      local_d8.prec_elem = pnVar2[iVar3].m_backend.prec_elem;
      local_88.data._M_elems[0xf]._1_3_ = local_128.data._M_elems[0xf]._1_3_;
      local_88.data._M_elems._56_5_ = local_128.data._M_elems._56_5_;
      local_88.data._M_elems[0] = local_128.data._M_elems[0];
      local_88.data._M_elems[1] = local_128.data._M_elems[1];
      local_88.data._M_elems[2] = local_128.data._M_elems[2];
      local_88.data._M_elems[3] = local_128.data._M_elems[3];
      local_88.data._M_elems[4] = local_128.data._M_elems[4];
      local_88.data._M_elems[5] = local_128.data._M_elems[5];
      local_88.data._M_elems[6] = local_128.data._M_elems[6];
      local_88.data._M_elems[7] = local_128.data._M_elems[7];
      local_88.data._M_elems[8] = local_128.data._M_elems[8];
      local_88.data._M_elems[9] = local_128.data._M_elems[9];
      local_88.data._M_elems[10] = local_128.data._M_elems[10];
      local_88.data._M_elems[0xb] = local_128.data._M_elems[0xb];
      local_88.data._M_elems[0xc] = local_128.data._M_elems[0xc];
      local_88.data._M_elems[0xd] = local_128.data._M_elems[0xd];
      local_88.exp = local_128.exp;
      local_88.neg = local_128.neg;
      local_88.fpclass = local_128.fpclass;
      local_88.prec_elem = local_128.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_88,&local_d8);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(&this->dualFarkas,iVar3,
            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&local_88);
      lVar5 = lVar5 + 1;
      pUVar4 = this->theCoPvec;
    } while (lVar5 < (pUVar4->thedelta).super_IdxSet.num);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Col(R direction)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(coPvec().delta().size());

   for(int i = 0; i < coPvec().delta().size(); ++i)
      dualFarkas.add(coPvec().delta().index(i), sign * coPvec().delta().value(i));
}